

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMinus<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
          *fadexpr)

{
  double dVar1;
  uint uVar2;
  uint uVar3;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>
  *pFVar4;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar5;
  Fad<double> *pFVar6;
  double *pdVar7;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *pFVar8;
  Fad<double> *pFVar9;
  double *pdVar10;
  double *pdVar11;
  ulong uVar12;
  value_type vVar13;
  double dVar14;
  
  pFVar4 = (fadexpr->fadexpr_).left_;
  uVar2 = (((((pFVar4->fadexpr_).left_)->fadexpr_).right_)->dx_).num_elts;
  uVar3 = (((((pFVar4->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts;
  if ((int)uVar3 < (int)uVar2) {
    uVar3 = uVar2;
  }
  uVar2 = (this->dx_).num_elts;
  if (uVar3 != uVar2) {
    if (uVar3 == 0) {
      if (uVar2 != 0) {
        pdVar11 = (this->dx_).ptr_to_data;
        if (pdVar11 != (double *)0x0) {
          operator_delete__(pdVar11);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar2 != 0) {
        pdVar11 = (this->dx_).ptr_to_data;
        if (pdVar11 != (double *)0x0) {
          operator_delete__(pdVar11);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar3;
      uVar12 = 0xffffffffffffffff;
      if (-1 < (int)uVar3) {
        uVar12 = (long)(int)uVar3 << 3;
      }
      pdVar11 = (double *)operator_new__(uVar12);
      (this->dx_).ptr_to_data = pdVar11;
    }
  }
  if (uVar3 != 0) {
    pdVar11 = (this->dx_).ptr_to_data;
    pFVar4 = (fadexpr->fadexpr_).left_;
    pFVar5 = (pFVar4->fadexpr_).left_;
    pFVar6 = (pFVar5->fadexpr_).right_;
    if (((pFVar6->dx_).num_elts == 0) ||
       ((((((pFVar4->fadexpr_).right_)->fadexpr_).right_)->dx_).num_elts == 0)) {
      if (0 < (int)uVar3) {
        uVar12 = 0;
        do {
          vVar13 = FadBinaryDiv<FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>
                   ::dx(&((fadexpr->fadexpr_).left_)->fadexpr_,(int)uVar12);
          pdVar11[uVar12] = vVar13;
          uVar12 = uVar12 + 1;
        } while (uVar3 != uVar12);
      }
    }
    else if (0 < (int)uVar3) {
      pdVar7 = (pFVar6->dx_).ptr_to_data;
      pFVar8 = (pFVar4->fadexpr_).right_;
      pFVar9 = (pFVar8->fadexpr_).right_;
      pdVar10 = (pFVar9->dx_).ptr_to_data;
      uVar12 = 0;
      do {
        dVar1 = (pFVar5->fadexpr_).left_.constant_;
        dVar14 = (pFVar8->fadexpr_).left_.constant_ - pFVar9->val_;
        pdVar11[uVar12] =
             (pdVar7[uVar12] * dVar1 * dVar14 + dVar1 * pFVar6->val_ * pdVar10[uVar12]) /
             (dVar14 * dVar14);
        uVar12 = uVar12 + 1;
      } while (uVar3 != uVar12);
    }
  }
  pFVar4 = (fadexpr->fadexpr_).left_;
  pFVar5 = (pFVar4->fadexpr_).left_;
  pFVar8 = (pFVar4->fadexpr_).right_;
  this->val_ = ((pFVar5->fadexpr_).left_.constant_ * ((pFVar5->fadexpr_).right_)->val_) /
               ((pFVar8->fadexpr_).left_.constant_ - ((pFVar8->fadexpr_).right_)->val_) -
               (fadexpr->fadexpr_).right_.constant_;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}